

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCCompatible.cpp
# Opt level: O1

unique_ptr<Reflection::Struct,_std::default_delete<Reflection::Struct>_> __thiscall
PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::get_options
          (ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0> *this)

{
  Display DVar1;
  Options *this_00;
  Display DVar2;
  long in_RSI;
  
  this_00 = (Options *)operator_new(0x10);
  PCCompatible::Machine::Options::Options(this_00,UserFriendly);
  DVar1 = (**(code **)(*(long *)(in_RSI + 0xe8) + 0x20))(in_RSI + 0xe8);
  DVar2 = RGB;
  if (DVar1 - SVideo < 3) {
    DVar2 = DVar1;
  }
  (this_00->super_DisplayOption<PCCompatible::Machine::Options>).output = DVar2;
  (this->super_Machine)._vptr_Machine = (_func_int **)this_00;
  return (__uniq_ptr_data<Reflection::Struct,_std::default_delete<Reflection::Struct>,_true,_true>)
         (__uniq_ptr_data<Reflection::Struct,_std::default_delete<Reflection::Struct>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<Reflection::Struct> get_options() override {
			auto options = std::make_unique<Options>(Configurable::OptionsType::UserFriendly);
			options->output = get_video_signal_configurable();
			return options;
		}